

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

int compare_dirnames(char *a,char *b)

{
  size_t sVar1;
  size_t sVar2;
  int local_28;
  int local_24;
  int blen;
  int alen;
  char *b_local;
  char *a_local;
  
  sVar1 = strlen(a);
  local_24 = (int)sVar1 + -1;
  sVar2 = strlen(b);
  local_28 = (int)sVar2 + -1;
  if ((local_24 < 0) || (local_28 < 0)) {
    a_local._4_4_ = local_24 - local_28;
  }
  else {
    if (a[local_24] != '/') {
      local_24 = (int)sVar1;
    }
    if (b[local_28] != '/') {
      local_28 = (int)sVar2;
    }
    if (local_24 == local_28) {
      a_local._4_4_ = strncmp(a,b,(long)local_24);
    }
    else {
      a_local._4_4_ = local_24 - local_28;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
compare_dirnames(const char *a, const char *b) {
  int alen, blen;

  // Get length of each string...
  alen = (int) (strlen(a) - 1);
  blen = (int) (strlen(b) - 1);

  if (alen < 0 || blen < 0) return alen - blen;

  // Check for trailing slashes...
  if (a[alen] != '/') alen ++;
  if (b[blen] != '/') blen ++;

  // If the lengths aren't the same, then return the difference...
  if (alen != blen) return alen - blen;

  // Do a comparison of the first N chars (alen == blen at this point)...
#ifdef WIN32
  return strncasecmp(a, b, alen);
#else
  return strncmp(a, b, alen);
#endif // WIN32
}